

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall cmXMLWriter::Attribute<char[17]>(cmXMLWriter *this,char *name,char (*value) [17])

{
  ostream *poVar1;
  cmXMLSafe local_38;
  char (*local_20) [17];
  char (*value_local) [17];
  char *name_local;
  cmXMLWriter *this_local;
  
  local_20 = value;
  value_local = (char (*) [17])name;
  name_local = (char *)this;
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,*value_local);
  poVar1 = std::operator<<(poVar1,"=\"");
  SafeAttribute(&local_38,*local_20);
  poVar1 = ::operator<<(poVar1,&local_38);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }